

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_freeCCtx(ZSTDMT_CCtx *mtctx)

{
  ZSTD_customMem cMem;
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  POOL_ctx *in_RDI;
  serialState_t *unaff_retaddr;
  ZSTD_CDict *in_stack_00000008;
  undefined8 in_stack_00000010;
  void *in_stack_00000020;
  ZSTDMT_CCtx *in_stack_00000030;
  undefined4 in_stack_fffffffffffffff8;
  U32 in_stack_fffffffffffffffc;
  
  if (in_RDI != (POOL_ctx *)0x0) {
    if ((in_RDI[0xc].queuePopCond.__size[0x10] & 1U) == 0) {
      POOL_free(in_RDI);
    }
    ZSTDMT_releaseAllJobResources(in_stack_00000030);
    cMem.customFree = (ZSTD_freeFunction)mtctx;
    cMem.customAlloc = (ZSTD_allocFunction)in_stack_00000010;
    cMem.opaque = in_stack_00000020;
    ZSTDMT_freeJobsTable((ZSTDMT_jobDescription *)unaff_retaddr,in_stack_fffffffffffffffc,cMem);
    ZSTDMT_freeBufferPool((ZSTDMT_bufferPool *)in_RDI);
    ZSTDMT_freeCCtxPool((ZSTDMT_CCtxPool *)in_RDI);
    ZSTDMT_freeSeqPool((ZSTDMT_seqPool *)0x2ed5a5);
    ZSTDMT_serialState_free(unaff_retaddr);
    ZSTD_freeCDict(in_stack_00000008);
    if (in_RDI[1].queueSize != 0) {
      customMem.customFree._0_4_ = in_stack_fffffffffffffff8;
      customMem.customAlloc = (ZSTD_allocFunction)in_RDI;
      customMem.customFree._4_4_ = in_stack_fffffffffffffffc;
      customMem.opaque = unaff_retaddr;
      ZSTD_customFree(*(void **)((long)&in_RDI[0xc].queuePushCond + 0x20),customMem);
    }
    customMem_00.customFree._0_4_ = in_stack_fffffffffffffff8;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_RDI;
    customMem_00.customFree._4_4_ = in_stack_fffffffffffffffc;
    customMem_00.opaque = unaff_retaddr;
    ZSTD_customFree(*(void **)((long)&in_RDI[0xc].queuePushCond + 0x20),customMem_00);
  }
  return 0;
}

Assistant:

size_t ZSTDMT_freeCCtx(ZSTDMT_CCtx* mtctx)
{
    if (mtctx==NULL) return 0;   /* compatible with free on NULL */
    if (!mtctx->providedFactory)
        POOL_free(mtctx->factory);   /* stop and free worker threads */
    ZSTDMT_releaseAllJobResources(mtctx);  /* release job resources into pools first */
    ZSTDMT_freeJobsTable(mtctx->jobs, mtctx->jobIDMask+1, mtctx->cMem);
    ZSTDMT_freeBufferPool(mtctx->bufPool);
    ZSTDMT_freeCCtxPool(mtctx->cctxPool);
    ZSTDMT_freeSeqPool(mtctx->seqPool);
    ZSTDMT_serialState_free(&mtctx->serial);
    ZSTD_freeCDict(mtctx->cdictLocal);
    if (mtctx->roundBuff.buffer)
        ZSTD_customFree(mtctx->roundBuff.buffer, mtctx->cMem);
    ZSTD_customFree(mtctx, mtctx->cMem);
    return 0;
}